

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Person.cpp
# Opt level: O2

void __thiscall mbc::Val::Person::update_ID_(Person *this)

{
  Str *this_00;
  string local_38;
  
  this_00 = this->ID_;
  hash__abi_cxx11_(&local_38,this);
  _ValAtom::set(&this_00->super__ValAtom,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Person::update_ID_() {
    ID_ -> set(hash_());
}